

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

SQChar * __thiscall
SQFunctionProto::GetLocal
          (SQFunctionProto *this,SQVM *vm,SQUnsignedInteger stackbase,SQUnsignedInteger nseq,
          SQUnsignedInteger nop)

{
  ulong in_RCX;
  long in_RDX;
  SQVM *in_RSI;
  long in_RDI;
  ulong in_R8;
  SQUnsignedInteger i;
  SQChar *res;
  SQUnsignedInteger nvars;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  ulong local_40;
  ulong local_20;
  
  if (in_RCX <= *(ulong *)(in_RDI + 0x68)) {
    local_20 = in_RCX;
    for (local_40 = 0; local_40 < *(ulong *)(in_RDI + 0x68); local_40 = local_40 + 1) {
      if ((*(ulong *)(*(long *)(in_RDI + 0x70) + local_40 * 0x28 + 0x10) <= in_R8) &&
         (in_R8 <= *(ulong *)(*(long *)(in_RDI + 0x70) + local_40 * 0x28 + 0x18))) {
        if (local_20 == 0) {
          sqvector<SQObjectPtr>::operator[]
                    (&in_RSI->_stack,
                     in_RDX + *(long *)(*(long *)(in_RDI + 0x70) + local_40 * 0x28 + 0x20));
          SQVM::Push(in_RSI,in_stack_ffffffffffffffa8);
          return (SQChar *)(*(long *)(*(long *)(in_RDI + 0x70) + local_40 * 0x28 + 8) + 0x38);
        }
        local_20 = local_20 - 1;
      }
    }
  }
  return (SQChar *)0x0;
}

Assistant:

const SQChar* SQFunctionProto::GetLocal(SQVM *vm,SQUnsignedInteger stackbase,SQUnsignedInteger nseq,SQUnsignedInteger nop)
{
    SQUnsignedInteger nvars=_nlocalvarinfos;
    const SQChar *res=NULL;
    if(nvars>=nseq){
        for(SQUnsignedInteger i=0;i<nvars;i++){
            if(_localvarinfos[i]._start_op<=nop && _localvarinfos[i]._end_op>=nop)
            {
                if(nseq==0){
                    vm->Push(vm->_stack[stackbase+_localvarinfos[i]._pos]);
                    res=_stringval(_localvarinfos[i]._name);
                    break;
                }
                nseq--;
            }
        }
    }
    return res;
}